

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_45(QPDF *pdf,char *arg2)

{
  QPDFWriter w;
  QPDFWriter aQStack_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  long local_28;
  long local_20;
  
  QPDFWriter::QPDFWriter(aQStack_38,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(aQStack_38,0));
  QPDFWriter::write();
  QPDF::getWarnings();
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector
            ((vector<QPDFExc,_std::allocator<QPDFExc>_> *)&local_28);
  if (local_28 == local_20) {
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    return;
  }
  exit(3);
}

Assistant:

static void
test_45(QPDF& pdf, char const* arg2)
{
    // Decode obfuscated files. This is here to help test with
    // files that trigger anti-virus warnings. See comments in
    // specific-bugs.test for details.
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.write();
    if (!pdf.getWarnings().empty()) {
        exit(3);
    }
}